

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O3

TheoryElement * __thiscall
Potassco::TheoryData::addElement(TheoryData *this,Id_t id,IdSpan *terms,Id_t cId)

{
  Data *pDVar1;
  void *pvVar2;
  undefined8 *puVar3;
  TheoryElement *pTVar4;
  uint32_t i;
  uint uVar5;
  ulong uVar6;
  size_t n;
  
  pDVar1 = this->data_;
  uVar6 = (pDVar1->elems).top >> 3;
  if (id < (uint)uVar6) {
    pvVar2 = *(void **)((long)(pDVar1->elems).mem.beg_ + (ulong)id * 8);
    if (pvVar2 != (void *)0x0) {
      if ((pDVar1->frame).elem <= id) {
        fail(-2,"const TheoryElement &Potassco::TheoryData::addElement(Id_t, const IdSpan &, Id_t)",
             0xea,"!isNewElement(id)","Redefinition of theory element \'%u\'",id,0);
      }
      operator_delete(pvVar2);
    }
  }
  else {
    do {
      pDVar1 = this->data_;
      n = (pDVar1->elems).top + 8;
      (pDVar1->elems).top = n;
      MemoryRegion::grow(&(pDVar1->elems).mem,n);
      puVar3 = (undefined8 *)MemoryRegion::operator[](&(pDVar1->elems).mem,(pDVar1->elems).top - 8);
      *puVar3 = 0;
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 <= id);
  }
  pTVar4 = TheoryElement::newElement(terms,cId);
  *(TheoryElement **)((long)(this->data_->elems).mem.beg_ + (ulong)id * 8) = pTVar4;
  return pTVar4;
}

Assistant:

const TheoryElement& TheoryData::addElement(Id_t id, const IdSpan& terms, Id_t cId) {
	if (!hasElement(id)) {
		for (uint32_t i = numElems(); i <= id; ++i) { data_->elems.push(); }
	}
	else {
		POTASSCO_REQUIRE(!isNewElement(id), "Redefinition of theory element '%u'", id);
		DestroyT()(elems()[id]);
	}
	return *(elems()[id] = TheoryElement::newElement(terms, cId));
}